

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_internals.c
# Opt level: O2

TA_RetCode circBufferFillFrom0ToSize(int size,int *buffer)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *__ptr;
  int iVar4;
  TA_RetCode TVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int local_MyBuf [4];
  
  __ptr = local_MyBuf;
  if ((size < 5) || (__ptr = (int *)malloc((ulong)(uint)size << 2), __ptr != (int *)0x0)) {
    iVar1 = size + -1;
    if (size < 1) {
      size = 0;
    }
    uVar6 = 0;
    iVar4 = 0;
    while (size != uVar6) {
      *(uint *)((long)__ptr + (long)iVar4 * 4) = uVar6;
      uVar6 = uVar6 + 1;
      bVar2 = iVar1 <= iVar4;
      iVar4 = iVar4 + 1;
      if (bVar2) {
        iVar4 = 0;
      }
    }
    lVar7 = 0;
    while (lVar7 != 3) {
      iVar3 = (int)lVar7;
      buffer[lVar7] = *(int *)((long)__ptr + (long)iVar4 * 4);
      lVar7 = lVar7 + 1;
      *(int *)((long)__ptr + (long)iVar4 * 4) = size + iVar3;
      bVar2 = iVar1 <= iVar4;
      iVar4 = iVar4 + 1;
      if (bVar2) {
        iVar4 = 0;
      }
    }
    for (uVar8 = 0; (uint)size != uVar8; uVar8 = uVar8 + 1) {
      buffer[uVar8 + 3] = *(int *)((long)__ptr + (long)iVar4 * 4);
      bVar2 = iVar1 <= iVar4;
      iVar4 = iVar4 + 1;
      if (bVar2) {
        iVar4 = 0;
      }
    }
    TVar5 = TA_SUCCESS;
    if (__ptr != local_MyBuf) {
      free(__ptr);
      TVar5 = TA_SUCCESS;
    }
  }
  else {
    TVar5 = TA_ALLOC_ERR;
  }
  return TVar5;
}

Assistant:

static TA_RetCode circBufferFillFrom0ToSize( int size, int *buffer )
{
   CIRCBUF_PROLOG(MyBuf,int,4);
   int i, value;
   int outIdx;

   CIRCBUF_INIT(MyBuf,int,size);

   outIdx = 0;

   // 1st Loop: Fill MyBuf with initial values
   //           (must be done).
   value = 0;
   for( i=0; i < size; i++ )
   {
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 2nd Loop: Get and Add subsequent values
   //           in MyBuf (optional)
   for( i=0; i < 3; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 3rd Loop: Empty MyBuf (optional)
   for( i=0; i < size; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      CIRCBUF_NEXT(MyBuf);
   }

   CIRCBUF_DESTROY(MyBuf);

   return TA_SUCCESS;
}